

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector
          (quad_value_bit_vector *this,quad_value_bit_vector *other)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  quad_value_bit_vector *in_RSI;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *in_RDI;
  int i;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *__new_size;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe4;
  
  __new_size = in_RDI;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::vector
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)0x19c895);
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::size(&in_RSI->bits);
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
            ((vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_type)__new_size);
  iVar1 = bitLength(in_RSI);
  *(int *)&in_RDI[1].super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
           .super__Vector_impl_data._M_start = iVar1;
  iVar1 = 0;
  while( true ) {
    iVar5 = iVar1;
    iVar2 = bitLength(in_RSI);
    if (iVar2 <= iVar1) break;
    pvVar3 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                       (&in_RSI->bits,(long)iVar5);
    pvVar4 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                       (in_RDI,(long)iVar5);
    pvVar4->value = pvVar3->value;
    iVar1 = iVar5 + 1;
  }
  return;
}

Assistant:

quad_value_bit_vector(const quad_value_bit_vector& other) {
      bits.resize(other.bits.size());
      N = other.bitLength();

      for (int i = 0; i < other.bitLength(); i++) {
	bits[i] = other.bits[i];
      }
    }